

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O3

Matrix4x4 * CMU462::Matrix4x4::scaling(Vector3D *s)

{
  Matrix4x4 *B_1;
  Matrix4x4 *B;
  
  B_1->entries[2].x = 0.0;
  B_1->entries[2].y = 0.0;
  B_1->entries[0].y = 0.0;
  B_1->entries[0].z = 0.0;
  B_1->entries[3].y = 0.0;
  B_1->entries[3].z = 0.0;
  B_1->entries[0].w = 0.0;
  B_1->entries[1].x = 0.0;
  B_1->entries[1].z = 0.0;
  B_1->entries[1].w = 0.0;
  B_1->entries[2].w = 0.0;
  B_1->entries[3].x = 0.0;
  B_1->entries[3].w = 1.0;
  B_1->entries[0].x = s->x;
  B_1->entries[1].y = s->y;
  B_1->entries[2].z = s->z;
  return B_1;
}

Assistant:

Matrix4x4 Matrix4x4::scaling(Vector3D s) {
    Matrix4x4 B = Matrix4x4::identity();
    B(0, 0) = s.x;
    B(1, 1) = s.y;
    B(2, 2) = s.z;

    return B;
  }